

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Native_File_Chooser_GTK.cxx
# Opt level: O1

void Fl_GTK_File_Chooser::probe_for_GTK_libs(void)

{
  void *pvVar1;
  void *pvVar2;
  long lVar3;
  
  pvVar1 = fl_dlopen("libglib-2.0.so","libglib-2.0.so.0");
  pvVar2 = fl_dlopen("libgtk-x11-2.0.so","libgtk-x11-2.0.so.0");
  if (pvVar1 == (void *)0x0 || pvVar2 == (void *)0x0) {
    pvVar2 = fl_dlopen("libgtk-3.so","libgtk-3.so.0");
  }
  if (pvVar2 != (void *)0x0 && pvVar1 != (void *)0x0) {
    dlerror();
    fl_g_free = (XX_g_free)dlsym(pvVar1,"g_free");
    lVar3 = dlerror();
    if (lVar3 == 0) {
      dlerror();
      fl_g_slist_nth_data = (XX_g_slist_nth_data)dlsym(pvVar1,"g_slist_nth_data");
      lVar3 = dlerror();
      if (lVar3 == 0) {
        dlerror();
        fl_g_slist_length = (XX_g_slist_length)dlsym(pvVar1,"g_slist_length");
        lVar3 = dlerror();
        if (lVar3 == 0) {
          dlerror();
          fl_g_slist_free = (XX_g_slist_free)dlsym(pvVar1,"g_slist_free");
          lVar3 = dlerror();
          if (lVar3 == 0) {
            dlerror();
            fl_gtk_init_check = (XX_gtk_init_check)dlsym(pvVar2,"gtk_init_check");
            lVar3 = dlerror();
            if (lVar3 == 0) {
              dlerror();
              fl_gtk_widget_destroy = (XX_gtk_widget_destroy)dlsym(pvVar2,"gtk_widget_destroy");
              lVar3 = dlerror();
              if (lVar3 == 0) {
                dlerror();
                fl_gtk_file_chooser_set_select_multiple =
                     (XX_gtk_file_chooser_set_select_multiple)
                     dlsym(pvVar2,"gtk_file_chooser_set_select_multiple");
                lVar3 = dlerror();
                if (lVar3 == 0) {
                  dlerror();
                  fl_gtk_file_chooser_set_do_overwrite_confirmation =
                       (XX_gtk_file_chooser_set_do_overwrite_confirmation)
                       dlsym(pvVar2,"gtk_file_chooser_set_do_overwrite_confirmation");
                  lVar3 = dlerror();
                  if (lVar3 == 0) {
                    dlerror();
                    fl_gtk_file_chooser_set_current_name =
                         (XX_gtk_file_chooser_set_current_name)
                         dlsym(pvVar2,"gtk_file_chooser_set_current_name");
                    lVar3 = dlerror();
                    if (lVar3 == 0) {
                      dlerror();
                      fl_gtk_file_chooser_set_current_folder =
                           (XX_gtk_file_chooser_set_current_folder)
                           dlsym(pvVar2,"gtk_file_chooser_set_current_folder");
                      lVar3 = dlerror();
                      if (lVar3 == 0) {
                        dlerror();
                        fl_gtk_file_chooser_set_create_folders =
                             (XX_gtk_file_chooser_set_create_folders)
                             dlsym(pvVar2,"gtk_file_chooser_set_create_folders");
                        lVar3 = dlerror();
                        if (lVar3 == 0) {
                          dlerror();
                          fl_gtk_file_chooser_get_select_multiple =
                               (XX_gtk_file_chooser_get_select_multiple)
                               dlsym(pvVar2,"gtk_file_chooser_get_select_multiple");
                          lVar3 = dlerror();
                          if (lVar3 == 0) {
                            dlerror();
                            fl_gtk_widget_hide = (XX_gtk_widget_hide)dlsym(pvVar2,"gtk_widget_hide")
                            ;
                            lVar3 = dlerror();
                            if (lVar3 == 0) {
                              dlerror();
                              fl_gtk_file_chooser_get_filename =
                                   (XX_gtk_file_chooser_get_filename)
                                   dlsym(pvVar2,"gtk_file_chooser_get_filename");
                              lVar3 = dlerror();
                              if (lVar3 == 0) {
                                dlerror();
                                fl_gtk_file_chooser_get_filenames =
                                     (XX_gtk_file_chooser_get_filenames)
                                     dlsym(pvVar2,"gtk_file_chooser_get_filenames");
                                lVar3 = dlerror();
                                if (lVar3 == 0) {
                                  dlerror();
                                  fl_gtk_main_iteration =
                                       (XX_gtk_main_iteration)dlsym(pvVar2,"gtk_main_iteration");
                                  lVar3 = dlerror();
                                  if (lVar3 == 0) {
                                    dlerror();
                                    fl_gtk_events_pending =
                                         (XX_gtk_events_pending)dlsym(pvVar2,"gtk_events_pending");
                                    lVar3 = dlerror();
                                    if (lVar3 == 0) {
                                      dlerror();
                                      fl_gtk_file_chooser_dialog_new =
                                           (XX_gtk_file_chooser_dialog_new)
                                           dlsym(pvVar2,"gtk_file_chooser_dialog_new");
                                      lVar3 = dlerror();
                                      if (lVar3 == 0) {
                                        dlerror();
                                        fl_gtk_file_chooser_add_filter =
                                             (XX_gtk_file_chooser_add_filter)
                                             dlsym(pvVar2,"gtk_file_chooser_add_filter");
                                        lVar3 = dlerror();
                                        if (lVar3 == 0) {
                                          dlerror();
                                          fl_gtk_file_chooser_get_filter =
                                               (XX_gtk_file_chooser_get_filter)
                                               dlsym(pvVar2,"gtk_file_chooser_get_filter");
                                          lVar3 = dlerror();
                                          if (lVar3 == 0) {
                                            dlerror();
                                            fl_gtk_file_chooser_set_filter =
                                                 (XX_gtk_file_chooser_set_filter)
                                                 dlsym(pvVar2,"gtk_file_chooser_set_filter");
                                            lVar3 = dlerror();
                                            if (lVar3 == 0) {
                                              dlerror();
                                              fl_gtk_file_filter_new =
                                                   (XX_gtk_file_filter_new)
                                                   dlsym(pvVar2,"gtk_file_filter_new");
                                              lVar3 = dlerror();
                                              if (lVar3 == 0) {
                                                dlerror();
                                                fl_gtk_file_filter_add_pattern =
                                                     (XX_gtk_file_filter_add_pattern)
                                                     dlsym(pvVar2,"gtk_file_filter_add_pattern");
                                                lVar3 = dlerror();
                                                if (lVar3 == 0) {
                                                  dlerror();
                                                  fl_gtk_file_filter_add_custom =
                                                       (XX_gtk_file_filter_add_custom)
                                                       dlsym(pvVar2,"gtk_file_filter_add_custom");
                                                  lVar3 = dlerror();
                                                  if (lVar3 == 0) {
                                                    dlerror();
                                                    fl_gtk_file_filter_set_name =
                                                         (XX_gtk_file_filter_set_name)
                                                         dlsym(pvVar2,"gtk_file_filter_set_name");
                                                    lVar3 = dlerror();
                                                    if (lVar3 == 0) {
                                                      dlerror();
                                                      fl_gtk_file_filter_get_name =
                                                           (XX_gtk_file_filter_get_name)
                                                           dlsym(pvVar2,"gtk_file_filter_get_name");
                                                      lVar3 = dlerror();
                                                      if (lVar3 == 0) {
                                                        dlerror();
                                                        fl_gtk_file_chooser_set_extra_widget =
                                                             (XX_gtk_file_chooser_set_extra_widget)
                                                             dlsym(pvVar2,
                                                  "gtk_file_chooser_set_extra_widget");
                                                  lVar3 = dlerror();
                                                  if (lVar3 == 0) {
                                                    dlerror();
                                                    fl_gtk_widget_show_now =
                                                         (XX_gtk_widget_show_now)
                                                         dlsym(pvVar2,"gtk_widget_show_now");
                                                    lVar3 = dlerror();
                                                    if (lVar3 == 0) {
                                                      dlerror();
                                                      fl_gtk_widget_get_window =
                                                           (XX_gtk_widget_get_window)
                                                           dlsym(pvVar2,"gtk_widget_get_window");
                                                      lVar3 = dlerror();
                                                      if (lVar3 == 0) {
                                                        dlerror();
                                                        fl_gdk_x11_drawable_get_xid =
                                                             (XX_gdk_x11_drawable_get_xid)
                                                             dlsym(pvVar2,"gdk_x11_drawable_get_xid"
                                                                  );
                                                        lVar3 = dlerror();
                                                        if (lVar3 == 0) {
                                                          dlerror();
                                                          fl_gtk_check_button_new_with_label =
                                                               (XX_gtk_check_button_new_with_label)
                                                               dlsym(pvVar2,
                                                  "gtk_check_button_new_with_label");
                                                  lVar3 = dlerror();
                                                  if (lVar3 == 0) {
                                                    dlerror();
                                                    fl_g_signal_connect_data =
                                                         (XX_g_signal_connect_data)
                                                         dlsym(pvVar2,"g_signal_connect_data");
                                                    lVar3 = dlerror();
                                                    if (lVar3 == 0) {
                                                      dlerror();
                                                      fl_gtk_toggle_button_get_active =
                                                           (XX_gtk_toggle_button_get_active)
                                                           dlsym(pvVar2,
                                                  "gtk_toggle_button_get_active");
                                                  lVar3 = dlerror();
                                                  if (lVar3 == 0) {
                                                    dlerror();
                                                    fl_gtk_file_chooser_set_show_hidden =
                                                         (XX_gtk_file_chooser_set_show_hidden)
                                                         dlsym(pvVar2,
                                                  "gtk_file_chooser_set_show_hidden");
                                                  lVar3 = dlerror();
                                                  if (lVar3 == 0) {
                                                    dlerror();
                                                    fl_gtk_file_chooser_get_show_hidden =
                                                         (XX_gtk_file_chooser_get_show_hidden)
                                                         dlsym(pvVar2,
                                                  "gtk_file_chooser_get_show_hidden");
                                                  lVar3 = dlerror();
                                                  if (lVar3 == 0) {
                                                    dlerror();
                                                    fl_gtk_toggle_button_set_active =
                                                         (XX_gtk_toggle_button_set_active)
                                                         dlsym(pvVar2,"gtk_toggle_button_set_active"
                                                              );
                                                    lVar3 = dlerror();
                                                    if (lVar3 == 0) {
                                                      did_find_GTK_libs = 1;
                                                      return;
                                                    }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    fprintf(_stderr,"%s\n",lVar3);
  }
  did_find_GTK_libs = 0;
  return;
}

Assistant:

void Fl_GTK_File_Chooser::probe_for_GTK_libs(void) {
#if HAVE_DLSYM && HAVE_DLFCN_H
  void *ptr_glib    = NULL;
  void *ptr_gtk     = NULL;
  
#   ifdef __APPLE_CC__ // allows testing on Darwin + X11
  ptr_glib    = dlopen("/sw/lib/libglib-2.0.dylib", RTLD_LAZY | RTLD_GLOBAL);
#   else
  ptr_glib    = fl_dlopen("libglib-2.0.so", "libglib-2.0.so.0");
#   endif
  // Try first with GTK2
#   ifdef __APPLE_CC__ // allows testing on Darwin + X11
  ptr_gtk     = dlopen("/sw/lib/libgtk-x11-2.0.dylib", RTLD_LAZY | RTLD_GLOBAL);
#else
  ptr_gtk     = fl_dlopen("libgtk-x11-2.0.so", "libgtk-x11-2.0.so.0");
#endif
  if (ptr_gtk && ptr_glib) {
#ifdef DEBUG
    puts("selected GTK-2\n");
#endif
  }
  else {// Try then with GTK3
    ptr_gtk     = fl_dlopen("libgtk-3.so", "libgtk-3.so.0");
#ifdef DEBUG
    if (ptr_gtk && ptr_glib) {
      puts("selected GTK-3\n");
    }
#endif
  }
  
  if((!ptr_glib) || (!ptr_gtk)) {
#ifdef DEBUG
    puts("Failure to load libglib or libgtk");
#endif
    did_find_GTK_libs = 0;
    return;
  }
  
  char *pc_dl_error; // used to report errors by the GET_SYM macro...
  // items we need from GLib
  GET_SYM(g_free, ptr_glib);
  GET_SYM(g_slist_nth_data, ptr_glib);
  GET_SYM(g_slist_length, ptr_glib);
  GET_SYM(g_slist_free, ptr_glib);
  // items we need from GTK
  GET_SYM(gtk_init_check, ptr_gtk);
  GET_SYM(gtk_widget_destroy, ptr_gtk);
  GET_SYM(gtk_file_chooser_set_select_multiple, ptr_gtk);
  GET_SYM(gtk_file_chooser_set_do_overwrite_confirmation, ptr_gtk);
  GET_SYM(gtk_file_chooser_set_current_name, ptr_gtk);
  GET_SYM(gtk_file_chooser_set_current_folder, ptr_gtk);
  GET_SYM(gtk_file_chooser_set_create_folders, ptr_gtk);
  GET_SYM(gtk_file_chooser_get_select_multiple, ptr_gtk);
  GET_SYM(gtk_widget_hide, ptr_gtk);
  GET_SYM(gtk_file_chooser_get_filename, ptr_gtk);
  GET_SYM(gtk_file_chooser_get_filenames, ptr_gtk);
  GET_SYM(gtk_main_iteration, ptr_gtk);
  GET_SYM(gtk_events_pending, ptr_gtk);
  GET_SYM(gtk_file_chooser_dialog_new, ptr_gtk);
  GET_SYM(gtk_file_chooser_add_filter, ptr_gtk);
  GET_SYM(gtk_file_chooser_get_filter, ptr_gtk);
  GET_SYM(gtk_file_chooser_set_filter, ptr_gtk);
  GET_SYM(gtk_file_filter_new, ptr_gtk);
  GET_SYM(gtk_file_filter_add_pattern, ptr_gtk);
  GET_SYM(gtk_file_filter_add_custom, ptr_gtk);
  GET_SYM(gtk_file_filter_set_name, ptr_gtk);
  GET_SYM(gtk_file_filter_get_name, ptr_gtk);
  GET_SYM(gtk_file_chooser_set_extra_widget, ptr_gtk);
  GET_SYM(gtk_widget_show_now, ptr_gtk);
  GET_SYM(gtk_widget_get_window, ptr_gtk);
  GET_SYM(gdk_x11_drawable_get_xid, ptr_gtk);
  GET_SYM(gtk_check_button_new_with_label, ptr_gtk);
  GET_SYM(g_signal_connect_data, ptr_gtk);
  GET_SYM(gtk_toggle_button_get_active, ptr_gtk);
  GET_SYM(gtk_file_chooser_set_show_hidden, ptr_gtk);
  GET_SYM(gtk_file_chooser_get_show_hidden, ptr_gtk);
  GET_SYM(gtk_toggle_button_set_active, ptr_gtk);
  
  did_find_GTK_libs = 1;
#endif
}